

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

Value * __thiscall cmGlobalGenerator::GetJson(Value *__return_storage_ptr__,cmGlobalGenerator *this)

{
  int iVar1;
  Value *pVVar2;
  Value local_60;
  String local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  (*this->_vptr_cmGlobalGenerator[3])(&local_38,this);
  Json::Value::Value(&local_60,&local_38);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x28])(this);
  Json::Value::Value(&local_60,SUB41(iVar1,0));
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"multiConfig");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmGlobalGenerator::GetJson() const
{
  Json::Value generator = Json::objectValue;
  generator["name"] = this->GetName();
  generator["multiConfig"] = this->IsMultiConfig();
  return generator;
}